

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

ostream * notch::io::operator<<(ostream *out,Array *xs)

{
  float *pfVar1;
  float *local_20;
  float *it;
  Array *xs_local;
  ostream *out_local;
  
  local_20 = core::std::begin<float>(xs);
  while( true ) {
    pfVar1 = core::std::end<float>(xs);
    if (local_20 == pfVar1) break;
    pfVar1 = core::std::begin<float>(xs);
    if (local_20 != pfVar1) {
      std::operator<<(out," ");
    }
    std::ostream::operator<<(out,*local_20);
    local_20 = local_20 + 1;
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Array &xs) {
    for (auto it = std::begin(xs); it != std::end(xs); ++it) {
        if (it != std::begin(xs)) {
            out << " ";
        }
        out << *it;
    }
    return out;
}